

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
::_update_entry(List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
                *this,Field_element *value,ID_index rowIndex,iterator *position)

{
  ID_index rowIndex_00;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  *pEVar1;
  reference ppEVar2;
  iterator *position_local;
  Field_element *pFStack_18;
  ID_index rowIndex_local;
  Field_element *value_local;
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  *this_local;
  
  position_local._4_4_ = rowIndex;
  pFStack_18 = value;
  value_local = (Field_element *)this;
  pEVar1 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
           ::construct<unsigned_int&,unsigned_int&>
                     ((New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
                       *)this->entryPool_,(uint *)this,(uint *)((long)&position_local + 4));
  ppEVar2 = std::
            _List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>
            ::operator*(position);
  *ppEVar2 = pEVar1;
  ppEVar2 = std::
            _List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>
            ::operator*(position);
  Entry_field_element<unsigned_int>::set_element
            (&(*ppEVar2)->super_Entry_field_element_option,pFStack_18);
  rowIndex_00 = position_local._4_4_;
  ppEVar2 = std::
            _List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>
            ::operator*(position);
  Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::insert_entry(&this->super_Row_access_option,rowIndex_00,*ppEVar2);
  return;
}

Assistant:

inline void List_column<Master_matrix>::_update_entry(const Field_element& value,
                                                      ID_index rowIndex,
                                                      const typename Column_support::iterator& position)
{
  if constexpr (Master_matrix::Option_list::has_row_access) {
    *position = entryPool_->construct(RA_opt::columnIndex_, rowIndex);
    (*position)->set_element(value);
    RA_opt::insert_entry(rowIndex, *position);
  } else {
    *position = entryPool_->construct(rowIndex);
    (*position)->set_element(value);
  }
}